

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

uint16_t quant_gather_eob(__m256i eob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m128i eob_s;
  __m128i eob_hi;
  __m128i eob_lo;
  
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = in_register_00001218;
  auVar1._0_8_ = in_YMM0_H;
  auVar2 = vpmaxsw_avx(auVar2,auVar1);
  auVar1 = vpinsrw_avx(ZEXT216(0x7fff),0x7fff,1);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,2);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,3);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,4);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,5);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,6);
  auVar1 = vpinsrw_avx(auVar1,0x7fff,7);
  auVar1 = vpsubusw_avx(auVar1,auVar2);
  auVar1 = vphminposuw_avx(auVar1);
  return 0x7fff - auVar1._0_2_;
}

Assistant:

static inline uint16_t quant_gather_eob(__m256i eob) {
  const __m128i eob_lo = _mm256_castsi256_si128(eob);
  const __m128i eob_hi = _mm256_extractf128_si256(eob, 1);
  __m128i eob_s = _mm_max_epi16(eob_lo, eob_hi);
  eob_s = _mm_subs_epu16(_mm_set1_epi16(INT16_MAX), eob_s);
  eob_s = _mm_minpos_epu16(eob_s);
  return INT16_MAX - _mm_extract_epi16(eob_s, 0);
}